

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O0

void phmap::priv::(anonymous_namespace)::
     ExpectOperationCounts<phmap::priv::(anonymous_namespace)::SizedBtreeSet<phmap::test_internal::MovableOnlyInstance,100,phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare>>
               (int expected_moves,int expected_comparisons,
               vector<int,_std::allocator<int>_> *values,InstanceTracker *tracker,
               SizedBtreeSet<phmap::test_internal::MovableOnlyInstance,_100,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare>
               *set)

{
  bool bVar1;
  reference piVar2;
  char *pcVar3;
  AssertHelper local_130;
  Message local_128;
  int local_11c;
  size_t local_118;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_3;
  Message local_f8;
  int local_ec;
  size_t local_e8;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_2;
  Message local_c8;
  size_t local_c0;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_1;
  Message local_a0;
  size_t local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar;
  pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>,_phmap::test_internal::MovableOnlyInstance_&,_phmap::test_internal::MovableOnlyInstance_*>,_bool>
  local_70;
  MovableOnlyInstance local_58;
  int local_44;
  const_iterator cStack_40;
  int v;
  const_iterator __end3;
  const_iterator __begin3;
  vector<int,_std::allocator<int>_> *__range3;
  SizedBtreeSet<phmap::test_internal::MovableOnlyInstance,_100,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare>
  *set_local;
  InstanceTracker *tracker_local;
  vector<int,_std::allocator<int>_> *values_local;
  int expected_comparisons_local;
  int expected_moves_local;
  
  values_local._0_4_ = expected_comparisons;
  values_local._4_4_ = expected_moves;
  __end3 = std::vector<int,_std::allocator<int>_>::begin(values);
  cStack_40 = std::vector<int,_std::allocator<int>_>::end(values);
  while (bVar1 = __gnu_cxx::operator!=(&__end3,&stack0xffffffffffffffc0), bVar1) {
    piVar2 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&__end3);
    local_44 = *piVar2;
    test_internal::MovableOnlyInstance::MovableOnlyInstance(&local_58,(long)local_44);
    btree_set_container<phmap::priv::btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>_>
    ::insert(&local_70,
             &set->
              super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>_>
             ,&local_58);
    test_internal::MovableOnlyInstance::~MovableOnlyInstance(&local_58);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end3);
  }
  btree_container<phmap::priv::btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>_>
  ::clear((btree_container<phmap::priv::btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>_>
           *)set);
  local_98 = test_internal::InstanceTracker::moves(tracker);
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_90,"tracker->moves()","expected_moves",&local_98,
             (int *)((long)&values_local + 4));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x565,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  local_c0 = test_internal::InstanceTracker::comparisons(tracker);
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_b8,"tracker->comparisons()","expected_comparisons",&local_c0,
             (int *)&values_local);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x566,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  local_e8 = test_internal::InstanceTracker::copies(tracker);
  local_ec = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_e0,"tracker->copies()","0",&local_e8,&local_ec);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x567,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  local_118 = test_internal::InstanceTracker::swaps(tracker);
  local_11c = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_110,"tracker->swaps()","0",&local_118,&local_11c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x568,pcVar3);
    testing::internal::AssertHelper::operator=(&local_130,&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  test_internal::InstanceTracker::ResetCopiesMovesSwaps(tracker);
  return;
}

Assistant:

void ExpectOperationCounts(const int expected_moves,
                               const int expected_comparisons,
                               const std::vector<int> &values,
                               InstanceTracker *tracker, Set *set) {
        for (const int v : values) set->insert(MovableOnlyInstance(v));
        set->clear();
        EXPECT_EQ(tracker->moves(), expected_moves);
        EXPECT_EQ(tracker->comparisons(), expected_comparisons);
        EXPECT_EQ(tracker->copies(), 0);
        EXPECT_EQ(tracker->swaps(), 0);
        tracker->ResetCopiesMovesSwaps();
    }